

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedback::CaptureSpecialInterleaved::CaptureSpecialInterleaved
          (CaptureSpecialInterleaved *this,Context *context,char *test_name,char *test_description)

{
  char *test_description_local;
  char *test_name_local;
  Context *context_local;
  CaptureSpecialInterleaved *this_local;
  
  deqp::TestCase::TestCase(&this->super_TestCase,context,test_name,test_description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__CaptureSpecialInterleaved_0321c7b0;
  this->m_context = context;
  this->m_program_id = 0;
  this->m_vao_id = 0;
  this->m_xfb_id = 0;
  memset(this->m_bo_id,0,8);
  return;
}

Assistant:

gl3cts::TransformFeedback::CaptureSpecialInterleaved::CaptureSpecialInterleaved(deqp::Context& context,
																				const char*	test_name,
																				const char*	test_description)
	: deqp::TestCase(context, test_name, test_description)
	, m_context(context)
	, m_program_id(0)
	, m_vao_id(0)
	, m_xfb_id(0)
{
	memset(m_bo_id, 0, sizeof(m_bo_id));
}